

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void simd::Invert(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                 uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uchar *puVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  long lVar6;
  byte bVar7;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  uchar *puVar8;
  uint uVar9;
  undefined4 in_register_0000008c;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  ulong uVar13;
  byte *pbVar14;
  uchar *puVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 in_ZMM0 [64];
  uint32_t local_78;
  uint32_t local_74;
  ImageTemplate<unsigned_char> *local_70;
  undefined8 local_68;
  undefined8 local_60;
  ImageTemplate<unsigned_char> local_58;
  
  local_60 = CONCAT44(in_register_0000008c,startYOut);
  local_68 = CONCAT44(in_register_00000014,startYIn);
  uVar17 = (ulong)simdType;
  local_70 = out;
  local_74 = width;
  while( true ) {
    local_78 = height;
    bVar7 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                      (in,local_70);
    auVar19 = in_ZMM0._0_32_;
    uVar13 = 0;
    uVar16 = (uint)uVar17;
    if (uVar16 < 4) {
      uVar13 = (ulong)*(uint *)(&DAT_001e55e0 + uVar17 * 4);
    }
    if (uVar16 == 3) break;
    uVar12 = (uint)uVar13;
    if (uVar12 <= local_74 * bVar7) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,startXIn,(uint32_t)local_68,local_70,startXOut,(uint32_t)local_60,local_74,
                 local_78);
      local_74 = local_74 * bVar7;
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
      local_58._data = (uchar *)0x0;
      local_58._type = local_70->_type;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)local_70,src);
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&local_74,&local_78,in,&local_58);
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
      uVar3 = in->_rowSize;
      uVar4 = local_70->_rowSize;
      uVar17 = local_74 / uVar13;
      uVar13 = (ulong)local_74 % uVar13;
      puVar15 = in->_data + (ulong)(startXIn * bVar7) + (ulong)((int)local_68 * uVar3);
      puVar8 = local_70->_data + (ulong)(startXOut * bVar7) + (ulong)((int)local_60 * uVar4);
      uVar10 = local_78 * uVar4;
      puVar1 = puVar8 + uVar10;
      uVar9 = (int)uVar17 * uVar12;
      if (uVar16 == 1) {
        if (uVar10 == 0) {
          return;
        }
        auVar5 = vpcmpeqd_avx(auVar19._0_16_,auVar19._0_16_);
        do {
          if (uVar12 <= local_74) {
            lVar18 = 0;
            do {
              lVar6 = lVar18 + 0x10;
              *(undefined1 (*) [16])(puVar8 + lVar18) =
                   auVar5 ^ *(undefined1 (*) [16])(puVar15 + lVar6 + -0x10);
              lVar18 = lVar18 + 0x10;
            } while (puVar15 + lVar6 != puVar15 + uVar17 * 0x10);
          }
          if (local_74 != uVar9) {
            pbVar11 = puVar8 + uVar9;
            pbVar2 = pbVar11 + uVar13;
            pbVar14 = puVar15 + uVar9;
            do {
              *pbVar11 = ~*pbVar14;
              pbVar11 = pbVar11 + 1;
              pbVar14 = pbVar14 + 1;
            } while (pbVar11 != pbVar2);
          }
          puVar8 = puVar8 + uVar4;
          puVar15 = puVar15 + uVar3;
        } while (puVar8 != puVar1);
        return;
      }
      if (uVar16 != 0) {
        return;
      }
      if (uVar10 == 0) {
        return;
      }
      auVar19 = vpcmpeqd_avx2(auVar19,auVar19);
      do {
        if (uVar12 <= local_74) {
          lVar18 = 0;
          do {
            lVar6 = lVar18 + 0x20;
            *(undefined1 (*) [32])(puVar8 + lVar18) =
                 auVar19 ^ *(undefined1 (*) [32])(puVar15 + lVar6 + -0x20);
            lVar18 = lVar18 + 0x20;
          } while (puVar15 + lVar6 != puVar15 + uVar17 * 0x20);
        }
        if (local_74 != uVar9) {
          pbVar11 = puVar8 + uVar9;
          pbVar2 = pbVar11 + uVar13;
          pbVar14 = puVar15 + uVar9;
          do {
            *pbVar11 = ~*pbVar14;
            pbVar11 = pbVar11 + 1;
            pbVar14 = pbVar14 + 1;
          } while (pbVar11 != pbVar2);
        }
        puVar8 = puVar8 + uVar4;
        puVar15 = puVar15 + uVar3;
      } while (puVar8 != puVar1);
      return;
    }
    if (uVar16 != 0) break;
    uVar17 = 1;
    height = local_78;
  }
  Image_Function::Invert
            (in,startXIn,(uint32_t)local_68,local_70,startXOut,(uint32_t)local_60,local_74,local_78)
  ;
  return;
}

Assistant:

void Invert( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( Invert( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::Invert( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }